

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O2

int __thiscall
CCollision::IntersectLine
          (CCollision *this,vec2 Pos0,vec2 Pos1,vec2 *pOutCollision,vec2 *pOutBeforeCollision)

{
  vec2 vVar1;
  bool bVar2;
  int iVar3;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar4;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar5;
  anon_union_4_2_94730284_for_vector2_base<float>_1 x;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar6;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar7;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 y;
  float fVar8;
  float fVar9;
  
  aVar4 = Pos0.field_0;
  aVar6 = Pos0.field_1;
  fVar8 = aVar4.x - Pos1.field_0.x;
  fVar9 = aVar6.y - Pos1.field_1.y;
  fVar8 = SQRT(fVar8 * fVar8 + fVar9 * fVar9) + 1.0;
  iVar3 = 0;
  x = aVar4;
  y = aVar6;
  do {
    aVar7 = y;
    aVar5 = x;
    if ((int)fVar8 < iVar3) {
      if (pOutCollision != (vec2 *)0x0) {
        *pOutCollision = Pos1;
      }
      if (pOutBeforeCollision != (vec2 *)0x0) {
        *pOutBeforeCollision = Pos1;
      }
      return 0;
    }
    fVar9 = (float)iVar3 * (1.0 / (float)(int)fVar8);
    x.x = fVar9 * (Pos1.field_0.x - aVar4.x) + aVar4.x;
    y.y = fVar9 * (Pos1.field_1.y - aVar6.y) + aVar6.y;
    bVar2 = CheckPoint(this,x.x,y.y,1);
    iVar3 = iVar3 + 1;
  } while (!bVar2);
  if (pOutCollision != (vec2 *)0x0) {
    (pOutCollision->field_0).x = (float)x;
    (pOutCollision->field_1).y = (float)y;
  }
  vVar1.field_1.y = aVar7.y;
  vVar1.field_0.x = aVar5.x;
  if (pOutBeforeCollision != (vec2 *)0x0) {
    *pOutBeforeCollision = vVar1;
  }
  iVar3 = GetCollisionAt(this,x.x,y.y);
  return iVar3;
}

Assistant:

int CCollision::IntersectLine(vec2 Pos0, vec2 Pos1, vec2 *pOutCollision, vec2 *pOutBeforeCollision) const
{
	const int End = distance(Pos0, Pos1)+1;
	const float InverseEnd = 1.0f/End;
	vec2 Last = Pos0;

	for(int i = 0; i <= End; i++)
	{
		vec2 Pos = mix(Pos0, Pos1, i*InverseEnd);
		if(CheckPoint(Pos.x, Pos.y))
		{
			if(pOutCollision)
				*pOutCollision = Pos;
			if(pOutBeforeCollision)
				*pOutBeforeCollision = Last;
			return GetCollisionAt(Pos.x, Pos.y);
		}
		Last = Pos;
	}
	if(pOutCollision)
		*pOutCollision = Pos1;
	if(pOutBeforeCollision)
		*pOutBeforeCollision = Pos1;
	return 0;
}